

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O2

void text_drawborder(t_text *x,_glist *glist,char *tag,int width2,int height2,int firsttime)

{
  _glist *p_Var1;
  int iVar2;
  _glist *p_Var3;
  _glist *x_00;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  undefined4 in_register_0000000c;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000084;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  int y2;
  int x2;
  ulong local_110;
  int y1;
  ulong local_100;
  int x1;
  ulong local_f0;
  char *tags [2];
  char tagR [128];
  
  sprintf(tagR,"%sR",tag,CONCAT44(in_register_0000000c,width2),
          CONCAT44(in_register_00000084,height2));
  text_getrect(&x->te_g,glist,&x1,&y1,&x2,&y2);
  iVar13 = y1;
  iVar12 = y2;
  switch(x->field_0x2e & 3) {
  case 0:
    if ((glist->field_0xe8 & 0x20) != 0) {
      tags[1] = "commentbar";
      tags[0] = tagR;
      p_Var3 = glist_getcanvas((_glist *)"commentbar");
      uVar7 = (ulong)(uint)x2;
      if (firsttime == 0) {
        pdgui_vmess((char *)0x0,"crs iiii",p_Var3,"coords",tagR,uVar7,(ulong)(uint)y1,uVar7,
                    (ulong)(uint)y2);
      }
      else {
        pdgui_vmess((char *)0x0,"crr iiii rS",p_Var3,"create","line",uVar7,(ulong)(uint)y1,uVar7,
                    (ulong)(uint)y2,"-tags",2,tags);
      }
    }
    goto LAB_0015ab17;
  case 1:
    pcVar14 = "\"\"";
    if ((x->te_g).g_pd == text_class) {
      pcVar14 = "-";
    }
    tags[1] = "obj";
    tags[0] = tagR;
    p_Var3 = glist_getcanvas((_glist *)0x1a9948);
    uVar7 = (ulong)(uint)x1;
    uVar5 = (ulong)(uint)y1;
    uVar6 = (ulong)(uint)x2;
    uVar9 = (ulong)(uint)y2;
    if (firsttime == 0) {
      pdgui_vmess((char *)0x0,"crs iiiiiiiiii",p_Var3,"coords",tagR,uVar7,uVar5,uVar6,uVar5,uVar6,
                  uVar9,uVar7,uVar9,uVar7,uVar5);
      p_Var3 = glist_getcanvas(x_00);
      pdgui_vmess((char *)0x0,"crs rr",p_Var3,"itemconfigure",tagR,"-dash",pcVar14);
    }
    else {
      local_110 = (ulong)(uint)glist->gl_zoom;
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii rr ri rr rS",p_Var3,"create","line",uVar7,uVar5,uVar6,
                  uVar5,uVar6,uVar9,uVar7,uVar9,uVar7,uVar5,"-dash",pcVar14,"-width",local_110,
                  "-capstyle","projecting","-tags",2,tags);
    }
    goto LAB_0015ab17;
  case 2:
    tags[1] = "msg";
    uVar4 = (ulong)(uint)y2;
    uVar6 = (ulong)(uint)y1;
    uVar7 = (long)(y2 - y1) / 4;
    iVar10 = glist->gl_zoom * 10;
    iVar2 = (int)uVar7;
    if (iVar2 < iVar10) {
      iVar10 = iVar2;
    }
    tags[0] = tagR;
    p_Var3 = glist_getcanvas((_glist *)(uVar7 & 0xffffffff));
    uVar9 = (ulong)(uint)x2;
    uVar8 = (ulong)(uint)(x2 + iVar10);
    uVar5 = (ulong)(uint)(iVar12 - iVar10);
    uVar11 = (ulong)(uint)(iVar10 + iVar13);
    uVar7 = (ulong)(uint)x1;
    local_110 = CONCAT44(local_110._4_4_,firsttime);
    if (firsttime == 0) {
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var3,"coords",tagR,uVar7,uVar6,uVar8,uVar6,
                  uVar9,uVar11,uVar9,uVar5,uVar8,uVar4,uVar7,uVar4,uVar7,uVar6);
    }
    else {
      uVar4 = (ulong)(uint)glist->gl_zoom;
      local_100 = uVar8;
      local_f0 = uVar4;
LAB_0015a966:
      pdgui_vmess((char *)0x0,"crr iiiiiiiiiiiiii ri rr rS",p_Var3,"create","line",uVar7,uVar6,uVar8
                  ,uVar6,uVar9,uVar11,uVar9,uVar5,uVar8,(ulong)(uint)iVar12,uVar7,
                  (ulong)(uint)iVar12,uVar7,uVar6,"-width",uVar4,"-capstyle","projecting","-tags",2,
                  tags);
    }
    break;
  case 3:
    local_110 = CONCAT44(local_110._4_4_,firsttime);
    iVar13 = (*(uint *)&x[2].te_outlet >> 3 & 1) * glist->gl_zoom;
    uVar7 = (ulong)(uint)(x1 + iVar13);
    local_100 = (ulong)(uint)(iVar13 + y1);
    if (*(int *)&x[1].te_g.g_pd - 1U < 2) {
      tags[1] = "atom";
      uVar6 = (ulong)(uint)y2;
      uVar5 = (long)(y2 - y1) / 4;
      tags[0] = tagR;
      p_Var3 = glist_getcanvas((_glist *)(uVar5 & 0xffffffff));
      uVar9 = (ulong)(uint)x2;
      iVar12 = (int)uVar5;
      local_f0 = (ulong)(uint)(x2 - iVar12);
      uVar5 = (ulong)(uint)(iVar12 + (int)local_100);
      if ((int)local_110 != 0) {
        pdgui_vmess((char *)0x0,"crr iiiiiiiiiiii ri rr rS",p_Var3,"create","line",uVar7,local_100,
                    local_f0,local_100,uVar9,uVar5,uVar9,uVar6,uVar7,uVar6,uVar7,local_100,"-width",
                    (ulong)(uint)(iVar13 + glist->gl_zoom),"-capstyle","projecting","-tags",2,tags);
        break;
      }
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiii",p_Var3,"coords",tagR,uVar7,local_100,local_f0,
                  local_100,uVar9,uVar5,uVar9,uVar6,uVar7,uVar6,uVar7,local_100);
      p_Var3 = extraout_RAX;
    }
    else {
      tags[1] = "atom";
      uVar6 = (ulong)(uint)y2;
      uVar5 = (long)(y2 - y1) / 4;
      tags[0] = tagR;
      p_Var3 = glist_getcanvas((_glist *)(uVar5 & 0xffffffff));
      uVar9 = (ulong)(uint)x2;
      iVar10 = (int)uVar5;
      uVar8 = (ulong)(uint)(x2 - iVar10);
      uVar5 = (ulong)(uint)(iVar12 - iVar10);
      uVar11 = (ulong)(uint)(iVar10 + (int)local_100);
      local_f0 = uVar9;
      if ((int)local_110 != 0) {
        uVar4 = (ulong)(uint)(iVar13 + glist->gl_zoom);
        uVar6 = local_100;
        goto LAB_0015a966;
      }
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var3,"coords",tagR,uVar7,local_100,uVar8,
                  local_100,uVar9,uVar11,uVar9,uVar5,uVar8,uVar6,uVar7,uVar6,uVar7,local_100);
      p_Var3 = extraout_RAX_00;
    }
    p_Var3 = glist_getcanvas(p_Var3);
    pdgui_vmess((char *)0x0,"crs ri",p_Var3,"itemconfigure",tagR,"-width",
                (ulong)(uint)(iVar13 + glist->gl_zoom));
  }
  firsttime = (int)local_110;
LAB_0015ab17:
  p_Var3 = (_glist *)pd_checkobject((t_pd *)x);
  if (p_Var3 != (_glist *)0x0) {
    p_Var1 = (_glist *)(ulong)(uint)x2;
    glist_drawiofor(glist,(t_object *)p_Var3,firsttime,tag,x1,y1,x2,y2);
    p_Var3 = p_Var1;
  }
  if (firsttime != 0) {
    p_Var3 = glist_getcanvas(p_Var3);
    pdgui_vmess((char *)0x0,"crr",p_Var3,"raise","cord");
  }
  return;
}

Assistant:

void text_drawborder(t_text *x, t_glist *glist,
    const char *tag, int width2, int height2, int firsttime)
{
    t_object *ob;
    int x1, y1, x2, y2, width, height, corner;
    char tagR[128];
    sprintf(tagR, "%sR", tag);
    text_getrect(&x->te_g, glist, &x1, &y1, &x2, &y2);
    width = x2 - x1;
    height = y2 - y1;
    if (x->te_type == T_OBJECT)
    {
        char *pattern = ((pd_class(&x->te_pd) == text_class) ? "-" : "\"\"");
        char *tags[] = {tagR, "obj"};
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiii rr ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1,
                "-dash", pattern,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1);
            pdgui_vmess(0, "crs rr",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-dash", pattern);
        }
    }
    else if (x->te_type == T_MESSAGE)
    {
        char *tags[] = {tagR, "msg"};
        corner = ((y2-y1)/4);
        if (corner > 10*glist->gl_zoom)
            corner = 10*glist->gl_zoom; /* looks bad if too big */
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1);
    }
    else if (x->te_type == T_ATOM && (((t_gatom *)x)->a_flavor == A_FLOAT ||
           ((t_gatom *)x)->a_flavor == A_SYMBOL))
    {
            /* number or symbol */
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner, x2, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2,  x1p, y2,  x1p, y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
    else if (x->te_type == T_ATOM ) /* list (ATOM but not float or symbol) */
    {
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist),
                "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2-corner,  x2-corner, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p,y1p, x2-corner,y1p, x2,y1p+corner, x2,y2-corner, x2-corner,y2, x1p,y2, x1p,y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
        /* for comments, just draw a bar on RHS if unlocked; when a visible
        canvas is unlocked we have to call this anew on all comments, and when
        locked we erase them all via the annoying "commentbar" tag. */
    else if (x->te_type == T_TEXT && glist->gl_edit)
    {
        char *tags[] = {tagR, "commentbar"};
        if (firsttime)
            pdgui_vmess(0, "crr iiii rS",
                glist_getcanvas(glist), "create", "line",
                x2, y1,  x2, y2,
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiii",
                glist_getcanvas(glist), "coords", tagR,
                x2, y1,  x2, y2);
    }
        /* draw inlets/outlets */

    if ((ob = pd_checkobject(&x->te_pd)))
        glist_drawiofor(glist, ob, firsttime, tag, x1, y1, x2, y2);
    if (firsttime) /* raise cords over everything else */
        pdgui_vmess(0, "crr", glist_getcanvas(glist), "raise", "cord");
}